

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

context_t cs::create_subcontext(context_t *cxt)

{
  domain_manager *pdVar1;
  domain_manager *func;
  domain_manager *pdVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  context_t cVar3;
  context_t *context;
  shared_ptr<cs::compiler_type> *in_stack_fffffffffffffaa8;
  shared_ptr<cs::compiler_type> *in_stack_fffffffffffffab0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffab8;
  function<cs_impl::any_()> *in_stack_fffffffffffffac0;
  shared_ptr<cs::context_type> *in_stack_fffffffffffffac8;
  unsigned_long *in_stack_fffffffffffffad8;
  stack_type<cs::domain_type,_std::allocator> **in_stack_fffffffffffffae0;
  undefined1 uVar4;
  shared_ptr<cs::context_type> *in_stack_fffffffffffffae8;
  var *in_stack_fffffffffffffb10;
  char (*name) [11];
  domain_manager *this;
  type_index *in_stack_fffffffffffffb28;
  function<cs_impl::any_()> *in_stack_fffffffffffffb30;
  type_index *in_stack_fffffffffffffb38;
  type_index *id;
  domain_manager *in_stack_fffffffffffffb40;
  function<cs_impl::any_()> *func_00;
  char (*in_stack_fffffffffffffb48) [7];
  char (*name_00) [9];
  domain_manager *in_stack_fffffffffffffb50;
  undefined1 local_2d8 [80];
  type_index local_288 [6];
  type_index local_258 [8];
  type_index local_218 [8];
  type_index local_1d8 [8];
  type_index local_198 [6];
  type_index local_168 [6];
  type_index local_138 [6];
  type_index local_108 [6];
  type_index local_d8 [6];
  type_index local_a8 [8];
  type_index local_68 [10];
  undefined1 local_11;
  
  cs_impl::init_extensions((cs_impl *)in_RDI);
  local_11 = 0;
  std::make_shared<cs::context_type>();
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x536781);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x53678d);
  std::
  make_shared<cs::instance_type,std::shared_ptr<cs::context_type>&,cs::stack_type<cs::domain_type,std::allocator>*&,unsigned_long&>
            (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  uVar4 = (undefined1)((ulong)in_stack_fffffffffffffae0 >> 0x38);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5367c9);
  std::shared_ptr<cs::instance_type>::operator=
            ((shared_ptr<cs::instance_type> *)in_stack_fffffffffffffab0,
             (shared_ptr<cs::instance_type> *)in_stack_fffffffffffffaa8);
  std::shared_ptr<cs::instance_type>::~shared_ptr((shared_ptr<cs::instance_type> *)0x5367f2);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5367ff);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x536814);
  std::shared_ptr<cs::compiler_type>::operator=(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8)
  ;
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x536831);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x53684c);
  cs_impl::any::operator=((any *)in_stack_fffffffffffffab0,(any *)in_stack_fffffffffffffaa8);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x536872);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x53687e);
  std::function<cs_impl::any()>::
  function<cs::create_subcontext(std::shared_ptr<cs::context_type>const&)::__0,void>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::type_index::type_index(local_68,(type_info *)&char::typeinfo);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_fffffffffffffab0,
             (shared_ptr<cs::name_space> *)in_stack_fffffffffffffaa8);
  domain_manager::add_buildin_type<char_const(&)[5]>
            (in_stack_fffffffffffffb50,(char (*) [5])in_stack_fffffffffffffb48,
             (function<cs_impl::any_()> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             (namespace_t *)in_stack_fffffffffffffb30);
  std::function<cs_impl::any()>::
  function<cs::create_subcontext(std::shared_ptr<cs::context_type>const&)::__1,void>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::type_index::type_index(local_a8,(type_info *)&numeric::typeinfo);
  domain_manager::add_buildin_type<char_const(&)[7]>
            (in_stack_fffffffffffffb40,(char (*) [7])in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  std::function<cs_impl::any()>::
  function<cs::create_subcontext(std::shared_ptr<cs::context_type>const&)::__2,void>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::type_index::type_index(local_d8,(type_info *)&numeric::typeinfo);
  domain_manager::add_buildin_type<char_const(&)[8]>
            (in_stack_fffffffffffffb40,(char (*) [8])in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  std::function<cs_impl::any()>::
  function<cs::create_subcontext(std::shared_ptr<cs::context_type>const&)::__3,void>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::type_index::type_index(local_108,(type_info *)&numeric::typeinfo);
  domain_manager::add_buildin_type<char_const(&)[6]>
            (in_stack_fffffffffffffb40,(char (*) [6])in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  std::function<cs_impl::any()>::
  function<cs::create_subcontext(std::shared_ptr<cs::context_type>const&)::__4,void>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::type_index::type_index(local_138,(type_info *)&bool::typeinfo);
  domain_manager::add_buildin_type<char_const(&)[8]>
            (in_stack_fffffffffffffb40,(char (*) [8])in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  std::function<cs_impl::any()>::
  function<cs::create_subcontext(std::shared_ptr<cs::context_type>const&)::__5,void>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::type_index::type_index(local_168,(type_info *)&pointer::typeinfo);
  domain_manager::add_buildin_type<char_const(&)[8]>
            (in_stack_fffffffffffffb40,(char (*) [8])in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  std::function<cs_impl::any()>::
  function<cs::create_subcontext(std::shared_ptr<cs::context_type>const&)::__6,void>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::type_index::type_index(local_198,(type_info *)&std::__cxx11::string::typeinfo);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_fffffffffffffab0,
             (shared_ptr<cs::name_space> *)in_stack_fffffffffffffaa8);
  domain_manager::add_buildin_type<char_const(&)[7]>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
             (function<cs_impl::any_()> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             (namespace_t *)in_stack_fffffffffffffb30);
  std::function<cs_impl::any()>::
  function<cs::create_subcontext(std::shared_ptr<cs::context_type>const&)::__7,void>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::type_index::type_index
            (local_1d8,
             (type_info *)&std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_fffffffffffffab0,
             (shared_ptr<cs::name_space> *)in_stack_fffffffffffffaa8);
  domain_manager::add_buildin_type<char_const(&)[5]>
            (in_stack_fffffffffffffb50,(char (*) [5])in_stack_fffffffffffffb48,
             (function<cs_impl::any_()> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             (namespace_t *)in_stack_fffffffffffffb30);
  std::function<cs_impl::any()>::
  function<cs::create_subcontext(std::shared_ptr<cs::context_type>const&)::__8,void>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::type_index::type_index
            (local_218,(type_info *)&std::deque<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo
            );
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_fffffffffffffab0,
             (shared_ptr<cs::name_space> *)in_stack_fffffffffffffaa8);
  domain_manager::add_buildin_type<char_const(&)[6]>
            (in_stack_fffffffffffffb50,(char (*) [6])in_stack_fffffffffffffb48,
             (function<cs_impl::any_()> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             (namespace_t *)in_stack_fffffffffffffb30);
  std::function<cs_impl::any()>::
  function<cs::create_subcontext(std::shared_ptr<cs::context_type>const&)::__9,void>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::type_index::type_index
            (local_258,(type_info *)&std::pair<cs_impl::any,cs_impl::any>::typeinfo);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_fffffffffffffab0,
             (shared_ptr<cs::name_space> *)in_stack_fffffffffffffaa8);
  domain_manager::add_buildin_type<char_const(&)[5]>
            (in_stack_fffffffffffffb50,(char (*) [5])in_stack_fffffffffffffb48,
             (function<cs_impl::any_()> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             (namespace_t *)in_stack_fffffffffffffb30);
  id = local_288;
  std::function<cs_impl::any()>::
  function<cs::create_subcontext(std::shared_ptr<cs::context_type>const&)::__10,void>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  func_00 = (function<cs_impl::any_()> *)(local_2d8 + 0x40);
  std::type_index::type_index
            ((type_index *)func_00,
             (type_info *)
             &phmap::
              flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>
              ::typeinfo);
  name_00 = (char (*) [9])(local_2d8 + 0x30);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_fffffffffffffab0,
             (shared_ptr<cs::name_space> *)in_stack_fffffffffffffaa8);
  pdVar1 = domain_manager::add_buildin_type<char_const(&)[9]>
                     (in_stack_fffffffffffffb50,name_00,func_00,id,
                      (namespace_t *)in_stack_fffffffffffffb30);
  name = (char (*) [11])(local_2d8 + 0x10);
  std::function<cs_impl::any()>::
  function<cs::create_subcontext(std::shared_ptr<cs::context_type>const&)::__11,void>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  this = (domain_manager *)local_2d8;
  std::type_index::type_index
            ((type_index *)this,
             (type_info *)
             &phmap::
              flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
              ::typeinfo);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_fffffffffffffab0,
             (shared_ptr<cs::name_space> *)in_stack_fffffffffffffaa8);
  domain_manager::add_buildin_type<char_const(&)[9]>
            (pdVar1,name_00,func_00,id,(namespace_t *)in_stack_fffffffffffffb30);
  cs_impl::any::make_constant<std::shared_ptr<cs::context_type>,std::shared_ptr<cs::context_type>&>
            (in_stack_fffffffffffffac8);
  pdVar1 = domain_manager::add_buildin_var<char_const(&)[8]>
                     (this,(char (*) [8])name,in_stack_fffffffffffffb10);
  cs_impl::any::
  make_protect<cs::callable,cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),cs::callable::types>
            ((_func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)
             in_stack_fffffffffffffac8,(types *)in_stack_fffffffffffffac0);
  domain_manager::add_buildin_var<char_const(&)[6]>(this,(char (*) [6])name,(var *)pdVar1);
  make_cni<cs::numeric(&)(cs_impl::any_const&)>
            ((_func_numeric_any_ptr *)in_stack_fffffffffffffae8,(bool)uVar4);
  domain_manager::add_buildin_var<char_const(&)[11]>(this,name,(var *)pdVar1);
  make_cni<std::__cxx11::string(&)(cs_impl::any_const&)>
            ((_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_any_ptr *)
             in_stack_fffffffffffffae8,(bool)uVar4);
  domain_manager::add_buildin_var<char_const(&)[10]>(this,(char (*) [10])name,(var *)pdVar1);
  make_cni<std::__cxx11::string(&)(cs_impl::any_const&)>
            ((_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_any_ptr *)
             in_stack_fffffffffffffae8,(bool)uVar4);
  domain_manager::add_buildin_var<char_const(&)[5]>(this,(char (*) [5])name,(var *)pdVar1);
  make_cni<cs_impl::any(&)(cs_impl::any_const&)>
            ((_func_any_any_ptr *)in_stack_fffffffffffffae8,(bool)uVar4);
  func = domain_manager::add_buildin_var<char_const(&)[6]>(this,(char (*) [6])name,(var *)pdVar1);
  make_cni<cs_impl::any(&)(cs_impl::any_const&)>((_func_any_any_ptr *)func,(bool)uVar4);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[5]>(this,(char (*) [5])name,(var *)pdVar1);
  uVar4 = (undefined1)((ulong)pdVar2 >> 0x38);
  make_cni<void(&)(cs_impl::any&,cs_impl::any&)>((_func_void_any_ptr_any_ptr *)func,(bool)uVar4);
  domain_manager::add_buildin_var<char_const(&)[5]>(this,(char (*) [5])name,(var *)pdVar1);
  make_cni<bool(&)(cs::type_id_const&,cs::type_id_const&)>
            ((_func_bool_type_id_ptr_type_id_ptr *)func,(bool)uVar4);
  domain_manager::add_buildin_var<char_const(&)[5]>(this,(char (*) [5])name,(var *)pdVar1);
  make_namespace((namespace_t *)in_stack_fffffffffffffaa8);
  domain_manager::add_buildin_var<char_const(&)[10]>(this,(char (*) [10])name,(var *)pdVar1);
  make_namespace((namespace_t *)in_stack_fffffffffffffaa8);
  domain_manager::add_buildin_var<char_const(&)[9]>(this,(char (*) [9])name,(var *)pdVar1);
  make_namespace((namespace_t *)in_stack_fffffffffffffaa8);
  domain_manager::add_buildin_var<char_const(&)[7]>(this,(char (*) [7])name,(var *)pdVar1);
  make_namespace((namespace_t *)in_stack_fffffffffffffaa8);
  domain_manager::add_buildin_var<char_const(&)[8]>(this,(char (*) [8])name,(var *)pdVar1);
  make_namespace((namespace_t *)in_stack_fffffffffffffaa8);
  domain_manager::add_buildin_var<char_const(&)[5]>(this,(char (*) [5])name,(var *)pdVar1);
  cs_impl::any::~any((any *)0x53717e);
  cs_impl::any::~any((any *)0x53718b);
  cs_impl::any::~any((any *)0x537198);
  cs_impl::any::~any((any *)0x5371a5);
  cs_impl::any::~any((any *)0x5371b2);
  cs_impl::any::~any((any *)0x5371bf);
  cs_impl::any::~any((any *)0x5371cc);
  cs_impl::any::~any((any *)0x5371d9);
  cs_impl::any::~any((any *)0x5371e6);
  cs_impl::any::~any((any *)0x5371f3);
  cs_impl::any::~any((any *)0x537200);
  cs_impl::any::~any((any *)0x53720d);
  cs_impl::any::~any((any *)0x53721a);
  cs_impl::any::~any((any *)0x537227);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x537234);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x537241);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x53724e);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x53725b);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x537268);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x537275);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x537282);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x53728f);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x53729c);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x5372a9);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x5372b6);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x5372c3);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x5372d0);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x5372dd);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x5372ea);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x5372f7);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x537304);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x537311);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x53731e);
  cVar3.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar3.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (context_t)cVar3.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

context_t create_subcontext(const context_t &cxt)
	{
		cs_impl::init_extensions();
		context_t context = std::make_shared<context_type>();
		context->instance = std::make_shared<instance_type>(context, cxt->instance->fiber_sp, current_process->stack_size);
		context->compiler = cxt->compiler;
		context->cmd_args = cxt->cmd_args;
		// Init Runtime
		context->instance->storage
		// Internal Types
		.add_buildin_type("char", []() -> var { return var::make<char>('\0'); }, typeid(char),
		                  cs_impl::char_ext)
		.add_buildin_type("number", []() -> var { return var::make<numeric>(0); }, typeid(numeric))
		.add_buildin_type("integer", []() -> var { return var::make<numeric>(0); }, typeid(numeric))
		.add_buildin_type("float", []() -> var { return var::make<numeric>(0.0); }, typeid(numeric))
		.add_buildin_type("boolean", []() -> var { return var::make<boolean>(true); }, typeid(boolean))
		.add_buildin_type("pointer", []() -> var { return var::make<pointer>(null_pointer); }, typeid(pointer))
		.add_buildin_type("string", []() -> var { return var::make<string>(); }, typeid(string),
		                  cs_impl::string_ext)
		.add_buildin_type("list", []() -> var { return var::make<list>(); }, typeid(list), cs_impl::list_ext)
		.add_buildin_type("array", []() -> var { return var::make<array>(); }, typeid(array),
		                  cs_impl::array_ext)
		.add_buildin_type("pair", []() -> var { return var::make<pair>(numeric(0), numeric(0)); }, typeid(pair),
		                  cs_impl::pair_ext)
		.add_buildin_type("hash_set", []() -> var { return var::make<hash_set>(); }, typeid(hash_set),
		                  cs_impl::hash_set_ext)
		.add_buildin_type("hash_map", []() -> var { return var::make<hash_map>(); }, typeid(hash_map),
		                  cs_impl::hash_map_ext)
		// Context
		.add_buildin_var("context", var::make_constant<context_t>(context))
		// Add Internal Functions to storage
		.add_buildin_var("range", var::make_protect<callable>(range, callable::types::request_fold))
		.add_buildin_var("to_integer", make_cni(to_integer, true))
		.add_buildin_var("to_string", make_cni(to_string, true))
		.add_buildin_var("type", make_cni(type, true))
		.add_buildin_var("clone", make_cni(clone))
		.add_buildin_var("move", make_cni(move))
		.add_buildin_var("swap", make_cni(swap, true))
		.add_buildin_var("is_a", make_cni(is_a, true))
		// Add extensions to storage
		.add_buildin_var("exception", make_namespace(cs_impl::except_ext))
		.add_buildin_var("iostream", make_namespace(cs_impl::iostream_ext))
		.add_buildin_var("system", make_namespace(cs_impl::system_ext))
		.add_buildin_var("runtime", make_namespace(cs_impl::runtime_ext))
		.add_buildin_var("math", make_namespace(cs_impl::math_ext));
		return context;
	}